

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

uint64_t lzma_stream_encoder_mt_memusage(lzma_mt *options)

{
  uint threads;
  lzma_ret lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t outbuf_size_max;
  uint64_t block_size;
  lzma_filter *filters;
  lzma_options_easy easy;
  
  lVar1 = get_options(options,&easy,&filters,&block_size,&outbuf_size_max);
  uVar5 = 0xffffffffffffffff;
  if (lVar1 == LZMA_OK) {
    threads = options->threads;
    uVar7 = block_size * threads;
    uVar2 = lzma_raw_encoder_memusage(filters);
    if ((((uVar2 != 0xffffffffffffffff) &&
         (uVar3 = lzma_outq_memusage(outbuf_size_max,threads), uVar3 != 0xffffffffffffffff)) &&
        (uVar7 <= (ulong)options->threads * -0x1c0 - 0x81c1)) &&
       (uVar6 = uVar2 * threads, uVar7 = (ulong)options->threads * 0x1c0 + uVar7 + 0x81c0,
       uVar4 = uVar7 + uVar6, !CARRY8(uVar7,uVar6))) {
      uVar5 = 0xffffffffffffffff;
      if (!CARRY8(uVar4,uVar3)) {
        uVar5 = uVar4 + uVar3;
      }
    }
  }
  return uVar5;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_stream_encoder_mt_memusage(const lzma_mt *options)
{
	lzma_options_easy easy;
	const lzma_filter *filters;
	uint64_t block_size;
	uint64_t outbuf_size_max;

	if (get_options(options, &easy, &filters, &block_size,
			&outbuf_size_max) != LZMA_OK)
		return UINT64_MAX;

	// Memory usage of the input buffers
	const uint64_t inbuf_memusage = options->threads * block_size;

	// Memory usage of the filter encoders
	uint64_t filters_memusage = lzma_raw_encoder_memusage(filters);
	if (filters_memusage == UINT64_MAX)
		return UINT64_MAX;

	filters_memusage *= options->threads;

	// Memory usage of the output queue
	const uint64_t outq_memusage = lzma_outq_memusage(
			outbuf_size_max, options->threads);
	if (outq_memusage == UINT64_MAX)
		return UINT64_MAX;

	// Sum them with overflow checking.
	uint64_t total_memusage = LZMA_MEMUSAGE_BASE
			+ sizeof(lzma_stream_coder)
			+ options->threads * sizeof(worker_thread);

	if (UINT64_MAX - total_memusage < inbuf_memusage)
		return UINT64_MAX;

	total_memusage += inbuf_memusage;

	if (UINT64_MAX - total_memusage < filters_memusage)
		return UINT64_MAX;

	total_memusage += filters_memusage;

	if (UINT64_MAX - total_memusage < outq_memusage)
		return UINT64_MAX;

	return total_memusage + outq_memusage;
}